

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void wabt::anon_unknown_1::ResolveTypeNames(Module *module,FuncDeclaration *decl)

{
  Index IVar1;
  FuncSignature *this;
  reference pvVar2;
  uint local_28;
  uint local_24;
  uint32_t result_index;
  uint32_t param_index;
  FuncSignature *signature;
  FuncDeclaration *decl_local;
  Module *module_local;
  
  if (decl != (FuncDeclaration *)0x0) {
    this = &decl->sig;
    local_24 = 0;
    while( true ) {
      IVar1 = FuncSignature::GetNumParams(this);
      if (IVar1 <= local_24) break;
      pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (&this->param_types,(ulong)local_24);
      ResolveTypeName(module,pvVar2,local_24,&(decl->sig).param_type_names);
      local_24 = local_24 + 1;
    }
    local_28 = 0;
    while( true ) {
      IVar1 = FuncSignature::GetNumResults(this);
      if (IVar1 <= local_28) break;
      pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (&(decl->sig).result_types,(ulong)local_28);
      ResolveTypeName(module,pvVar2,local_28,&(decl->sig).result_type_names);
      local_28 = local_28 + 1;
    }
    return;
  }
  __assert_fail("decl",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0x14b,
                "void wabt::(anonymous namespace)::ResolveTypeNames(const Module &, FuncDeclaration *)"
               );
}

Assistant:

void ResolveTypeNames(const Module& module, FuncDeclaration* decl) {
  assert(decl);
  auto& signature = decl->sig;

  for (uint32_t param_index = 0; param_index < signature.GetNumParams();
       ++param_index) {
    ResolveTypeName(module, signature.param_types[param_index], param_index,
                    signature.param_type_names);
  }

  for (uint32_t result_index = 0; result_index < signature.GetNumResults();
       ++result_index) {
    ResolveTypeName(module, signature.result_types[result_index], result_index,
                    signature.result_type_names);
  }
}